

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O1

void PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(PoolResource<128UL,_8UL> *resource)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  _List_node_base *p_Var7;
  size_t freelist_idx;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  byte *ptr;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> chunks;
  long num_available_bytes;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  free_blocks;
  size_t local_88;
  _List_node_base *local_80;
  ulong *local_78;
  ulong *puStack_70;
  long local_68;
  ListNode *local_60;
  ulong *local_58;
  ulong *puStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (ulong *)0x0;
  puStack_50 = (ulong *)0x0;
  local_48 = 0;
  lVar8 = 0;
  do {
    local_78 = (ulong *)(lVar8 * 8);
    for (local_60 = (resource->m_free_lists)._M_elems[lVar8]; local_60 != (ListNode *)0x0;
        local_60 = local_60->m_next) {
      std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
      emplace_back<PoolResource<128ul,8ul>::ListNode*&,unsigned_long&>
                ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                  *)&local_58,&local_60,(unsigned_long *)&local_78);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  local_60 = (ListNode *)(resource->m_available_memory_end + -(long)resource->m_available_memory_it)
  ;
  if (0 < (long)local_60) {
    std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
    emplace_back<std::byte*const&,long&>
              ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                *)&local_58,&resource->m_available_memory_it,(long *)&local_60);
  }
  local_78 = (ulong *)0x0;
  puStack_70 = (ulong *)0x0;
  local_68 = 0;
  p_Var7 = (resource->m_allocated_chunks).
           super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)&resource->m_allocated_chunks) {
    do {
      local_80 = p_Var7[1]._M_next;
      local_88 = resource->m_chunk_size_bytes;
      std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
      emplace_back<std::byte_const*&,unsigned_long>
                ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                  *)&local_78,(byte **)&local_80,&local_88);
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&resource->m_allocated_chunks);
  }
  puVar6 = puStack_50;
  puVar2 = local_58;
  if (local_58 != puStack_50) {
    uVar3 = (long)puStack_50 - (long)local_58 >> 4;
    lVar8 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,puStack_50,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar6);
  }
  puVar6 = puStack_70;
  puVar2 = local_78;
  if (local_78 != puStack_70) {
    uVar3 = (long)puStack_70 - (long)local_78 >> 4;
    lVar8 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78,puStack_70,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar6);
  }
  uVar3 = *local_78;
  uVar4 = local_78[1];
  puVar2 = local_78;
  for (puVar6 = local_58; puVar6 != puStack_50; puVar6 = puVar6 + 2) {
    puVar5 = puVar2;
    if (uVar4 == 0) {
      if (puVar2 == puStack_70) {
        __assert_fail("chunk_it != chunks.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                      ,0x6d,
                      "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                     );
      }
      puVar5 = puVar2 + 2;
      if (puVar5 == puStack_70) {
        __assert_fail("chunk_it != chunks.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                      ,0x6f,
                      "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                     );
      }
      uVar3 = puVar2[2];
      uVar4 = puVar2[3];
    }
    if (*puVar6 != uVar3) {
      __assert_fail("free_block.ptr == chunk_ptr_remaining",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x73,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                   );
    }
    uVar1 = puVar6[1];
    bVar9 = uVar4 < uVar1;
    uVar4 = uVar4 - uVar1;
    if (bVar9) {
      __assert_fail("free_block.size <= chunk_size_remaining",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x74,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                   );
    }
    if ((*puVar6 & 7) != 0) {
      __assert_fail("(free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x75,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                   );
    }
    uVar3 = uVar1 + uVar3;
    puVar2 = puVar5;
  }
  if (uVar3 != puVar2[1] + *puVar2) {
    __assert_fail("chunk_ptr_remaining == chunk_it->ptr + chunk_it->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7a,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                 );
  }
  if (puVar2 + 2 != puStack_70) {
    __assert_fail("chunk_it == chunks.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7c,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                 );
  }
  if (uVar4 != 0) {
    __assert_fail("chunk_size_remaining == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7d,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                 );
  }
  operator_delete(local_78,local_68 - (long)local_78);
  if (local_58 != (ulong *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        // collect all free blocks by iterating all freelists
        std::vector<PtrAndBytes> free_blocks;
        for (std::size_t freelist_idx = 0; freelist_idx < resource.m_free_lists.size(); ++freelist_idx) {
            std::size_t bytes = freelist_idx * resource.ELEM_ALIGN_BYTES;
            auto* ptr = resource.m_free_lists[freelist_idx];
            while (ptr != nullptr) {
                free_blocks.emplace_back(ptr, bytes);
                ptr = ptr->m_next;
            }
        }
        // also add whatever has not yet been used for blocks
        auto num_available_bytes = resource.m_available_memory_end - resource.m_available_memory_it;
        if (num_available_bytes > 0) {
            free_blocks.emplace_back(resource.m_available_memory_it, num_available_bytes);
        }

        // collect all chunks
        std::vector<PtrAndBytes> chunks;
        for (const std::byte* ptr : resource.m_allocated_chunks) {
            chunks.emplace_back(ptr, resource.ChunkSizeBytes());
        }

        // now we have all the data from all freelists on the one hand side, and all chunks on the other hand side.
        // To check if all of them match, sort by address and iterate.
        std::sort(free_blocks.begin(), free_blocks.end());
        std::sort(chunks.begin(), chunks.end());

        auto chunk_it = chunks.begin();
        auto chunk_ptr_remaining = chunk_it->ptr;
        auto chunk_size_remaining = chunk_it->size;
        for (const auto& free_block : free_blocks) {
            if (chunk_size_remaining == 0) {
                assert(chunk_it != chunks.end());
                ++chunk_it;
                assert(chunk_it != chunks.end());
                chunk_ptr_remaining = chunk_it->ptr;
                chunk_size_remaining = chunk_it->size;
            }
            assert(free_block.ptr == chunk_ptr_remaining);                   // ensure addresses match
            assert(free_block.size <= chunk_size_remaining);                 // ensure no overflow
            assert((free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0); // ensure correct alignment
            chunk_ptr_remaining += free_block.size;
            chunk_size_remaining -= free_block.size;
        }
        // ensure we are at the end of the chunks
        assert(chunk_ptr_remaining == chunk_it->ptr + chunk_it->size);
        ++chunk_it;
        assert(chunk_it == chunks.end());
        assert(chunk_size_remaining == 0);
    }